

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.h
# Opt level: O0

long Vec3::random(void)

{
  Vec3 *in_RDI;
  double in_XMM0_Qa;
  double x;
  double y;
  double z;
  double in_XMM1_Qa;
  double max_local;
  double min_local;
  
  x = random_double(in_XMM0_Qa,in_XMM1_Qa);
  y = random_double(in_XMM0_Qa,in_XMM1_Qa);
  z = random_double(in_XMM0_Qa,in_XMM1_Qa);
  Vec3(in_RDI,x,y,z);
  return (long)in_RDI;
}

Assistant:

inline static Vec3 random(double min, double max) {
            return Vec3(random_double(min,max),random_double(min,max), random_double(min,max));
        }